

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleTimeZone::construct
          (SimpleTimeZone *this,int32_t rawOffsetGMT,int8_t savingsStartMonth,int8_t savingsStartDay
          ,int8_t savingsStartDayOfWeek,int32_t savingsStartTime,TimeMode savingsStartTimeMode,
          int8_t savingsEndMonth,int8_t savingsEndDay,int8_t savingsEndDayOfWeek,
          int32_t savingsEndTime,TimeMode savingsEndTimeMode,int32_t savingsDST,UErrorCode *status)

{
  this->rawOffset = rawOffsetGMT;
  this->startMonth = savingsStartMonth;
  this->startDay = savingsStartDay;
  this->startDayOfWeek = savingsStartDayOfWeek;
  this->startTime = savingsStartTime;
  this->startTimeMode = savingsStartTimeMode;
  this->endMonth = savingsEndMonth;
  this->endDay = savingsEndDay;
  this->endDayOfWeek = savingsEndDayOfWeek;
  this->endTime = savingsEndTime;
  this->endTimeMode = savingsEndTimeMode;
  this->dstSavings = savingsDST;
  this->startYear = 0;
  this->startMode = DOM_MODE;
  this->endMode = DOM_MODE;
  decodeStartRule(this,status);
  decodeEndRule(this,status);
  if (savingsDST == 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

void SimpleTimeZone::construct(int32_t rawOffsetGMT,
                               int8_t savingsStartMonth,
                               int8_t savingsStartDay,
                               int8_t savingsStartDayOfWeek,
                               int32_t savingsStartTime,
                               TimeMode savingsStartTimeMode,
                               int8_t savingsEndMonth,
                               int8_t savingsEndDay,
                               int8_t savingsEndDayOfWeek,
                               int32_t savingsEndTime,
                               TimeMode savingsEndTimeMode,
                               int32_t savingsDST,
                               UErrorCode& status)
{
    this->rawOffset      = rawOffsetGMT;
    this->startMonth     = savingsStartMonth;
    this->startDay       = savingsStartDay;
    this->startDayOfWeek = savingsStartDayOfWeek;
    this->startTime      = savingsStartTime;
    this->startTimeMode  = savingsStartTimeMode;
    this->endMonth       = savingsEndMonth;
    this->endDay         = savingsEndDay;
    this->endDayOfWeek   = savingsEndDayOfWeek;
    this->endTime        = savingsEndTime;
    this->endTimeMode    = savingsEndTimeMode;
    this->dstSavings     = savingsDST;
    this->startYear      = 0;
    this->startMode      = DOM_MODE;
    this->endMode        = DOM_MODE;

    decodeRules(status);

    if (savingsDST == 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
}